

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_optype(lua_State *L,cTValue *o,ErrMsg opm)

{
  char *pcVar1;
  uint local_54;
  char *kind;
  char *oname;
  BCIns *pc;
  GCproto *pt;
  char *opname;
  char *tname;
  cTValue *pcStack_18;
  ErrMsg opm_local;
  cTValue *o_local;
  lua_State *L_local;
  
  if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff3) {
    local_54 = 0xd;
  }
  else {
    local_54 = (int)(o->field_4).it >> 0xf ^ 0xffffffff;
  }
  opname = lj_obj_itypename[local_54];
  pt = (GCproto *)(lj_err_allmsg + (int)opm);
  tname._4_4_ = opm;
  pcStack_18 = o;
  o_local = (cTValue *)L;
  if (*(char *)((L->base[-2].u64 & 0x7fffffffffff) + 10) == '\0') {
    pc = (BCIns *)(*(long *)((L->base[-2].u64 & 0x7fffffffffff) + 0x20) + -0x68);
    oname = (char *)(*(long *)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x18) + -4);
    kind = (char *)0x0;
    pcVar1 = lj_debug_slotname((GCproto *)pc,(BCIns *)oname,(BCReg)((long)o - (long)L->base >> 3),
                               &kind);
    if (pcVar1 != (char *)0x0) {
      err_msgv((lua_State *)&o_local->gcr,LJ_ERR_BADOPRT,pt,pcVar1,kind,opname);
    }
  }
  err_msgv((lua_State *)&o_local->gcr,LJ_ERR_BADOPRV,pt,opname);
}

Assistant:

LJ_NOINLINE void lj_err_optype(lua_State *L, cTValue *o, ErrMsg opm)
{
  const char *tname = lj_typename(o);
  const char *opname = err2msg(opm);
  if (curr_funcisL(L)) {
    GCproto *pt = curr_proto(L);
    const BCIns *pc = cframe_Lpc(L) - 1;
    const char *oname = NULL;
    const char *kind = lj_debug_slotname(pt, pc, (BCReg)(o-L->base), &oname);
    if (kind)
      err_msgv(L, LJ_ERR_BADOPRT, opname, kind, oname, tname);
  }
  err_msgv(L, LJ_ERR_BADOPRV, opname, tname);
}